

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O2

void __thiscall raspicam::_private::Private_Impl_Still::commitAWB(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  ostream *poVar2;
  MMAL_PARAMETER_AWBMODE_T param;
  MMAL_PARAMETER_HEADER_T local_1c;
  MMAL_PARAM_AWBMODE_T local_14;
  
  local_1c.id = 0x10005;
  local_1c.size = 0xc;
  local_14 = convertAWB(this,this->awb);
  MVar1 = mmal_port_parameter_set(this->camera->control,&local_1c);
  if (MVar1 != MMAL_SUCCESS) {
    poVar2 = std::operator<<((ostream *)&std::cout,this->API_NAME);
    std::operator<<(poVar2,": Failed to set AWB parameter.\n");
  }
  return;
}

Assistant:

void Private_Impl_Still::commitAWB() {
            MMAL_PARAMETER_AWBMODE_T param = {{MMAL_PARAMETER_AWB_MODE,sizeof ( param ) }, convertAWB ( awb ) };
            if ( mmal_port_parameter_set ( camera->control, &param.hdr ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set AWB parameter.\n";
        }